

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnReturn(TypeChecker *this)

{
  Result RVar1;
  Result RVar2;
  Enum EVar3;
  Label *in_RAX;
  Label *func_label;
  
  func_label = in_RAX;
  RVar1 = GetThisFunctionLabel(this,&func_label);
  if (RVar1.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    RVar1 = PopAndCheckSignature(this,&func_label->result_types,"return");
    RVar2 = SetUnreachable(this);
    EVar3 = (Enum)(RVar2.enum_ == Error || RVar1.enum_ == Error);
  }
  return (Result)EVar3;
}

Assistant:

Result TypeChecker::OnReturn() {
  Result result = Result::Ok;
  Label* func_label;
  CHECK_RESULT(GetThisFunctionLabel(&func_label));
  result |= PopAndCheckSignature(func_label->result_types, "return");
  CHECK_RESULT(SetUnreachable());
  return result;
}